

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingStateQueryTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::VertexAttributeBindingStateQueryTests::init
          (VertexAttributeBindingStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  Context *pCVar2;
  VertexAttributeBindingStateQueryTests *pVVar3;
  int extraout_EAX;
  TestNode *pTVar4;
  TestNode *pTVar5;
  long *plVar6;
  long *plVar7;
  long lVar8;
  long *local_88;
  long local_78;
  long lStack_70;
  long *local_68 [2];
  long local_58 [2];
  VertexAttributeBindingStateQueryTests *local_48;
  TestNode *local_40;
  TestNode *local_38;
  
  pTVar4 = (TestNode *)operator_new(0x78);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,pCVar2->m_testCtx,"vertex_attrib","Vertex attribute state");
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0;
  pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar5 = (TestNode *)operator_new(0x78);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,pCVar2->m_testCtx,"indexed","Indexed state");
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0;
  pTVar5[1]._vptr_TestNode = (_func_int **)pCVar2;
  local_38 = pTVar4;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  lVar8 = 0;
  local_48 = this;
  local_40 = pTVar5;
  do {
    local_88 = &local_78;
    pTVar4 = (TestNode *)operator_new(0x80);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"vertex_attrib_binding","");
    plVar6 = (long *)std::__cxx11::string::append((char *)local_68);
    plVar7 = plVar6 + 2;
    if ((long *)*plVar6 == plVar7) {
      local_78 = *plVar7;
      lStack_70 = plVar6[3];
    }
    else {
      local_78 = *plVar7;
      local_88 = (long *)*plVar6;
    }
    *plVar6 = (long)plVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    uVar1 = *(undefined4 *)((long)&init::verifiers[0].type + lVar8);
    tcu::TestCase::TestCase
              ((TestCase *)pTVar4,pCVar2->m_testCtx,(char *)local_88,"Test VERTEX_ATTRIB_BINDING");
    pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
    *(undefined4 *)&pTVar4[1].m_testCtx = uVar1;
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a6438;
    tcu::TestNode::addChild(local_38,pTVar4);
    if (local_88 != &local_78) {
      operator_delete(local_88,local_78 + 1);
    }
    pVVar3 = local_48;
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] + 1);
    }
    pTVar4 = (TestNode *)operator_new(0x80);
    pCVar2 = (pVVar3->super_TestCaseGroup).m_context;
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"vertex_attrib_relative_offset","");
    plVar6 = (long *)std::__cxx11::string::append((char *)local_68);
    local_88 = &local_78;
    plVar7 = plVar6 + 2;
    if ((long *)*plVar6 == plVar7) {
      local_78 = *plVar7;
      lStack_70 = plVar6[3];
    }
    else {
      local_78 = *plVar7;
      local_88 = (long *)*plVar6;
    }
    *plVar6 = (long)plVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar4,pCVar2->m_testCtx,(char *)local_88,
               "Test VERTEX_ATTRIB_RELATIVE_OFFSET");
    pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
    *(undefined4 *)&pTVar4[1].m_testCtx = uVar1;
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a64e8;
    tcu::TestNode::addChild(local_38,pTVar4);
    if (local_88 != &local_78) {
      operator_delete(local_88,local_78 + 1);
    }
    this = local_48;
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] + 1);
    }
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x40);
  lVar8 = 8;
  do {
    pTVar4 = (TestNode *)operator_new(0x80);
    pCVar2 = (local_48->super_TestCaseGroup).m_context;
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"vertex_binding_divisor_","")
    ;
    plVar6 = (long *)std::__cxx11::string::append((char *)local_68);
    local_88 = &local_78;
    plVar7 = plVar6 + 2;
    if ((long *)*plVar6 == plVar7) {
      local_78 = *plVar7;
      lStack_70 = plVar6[3];
    }
    else {
      local_78 = *plVar7;
      local_88 = (long *)*plVar6;
    }
    *plVar6 = (long)plVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    uVar1 = *(undefined4 *)((long)&init()::verifiers[0].name + lVar8);
    tcu::TestCase::TestCase
              ((TestCase *)pTVar4,pCVar2->m_testCtx,(char *)local_88,"Test VERTEX_BINDING_DIVISOR");
    pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
    *(undefined4 *)&pTVar4[1].m_testCtx = uVar1;
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a6540;
    tcu::TestNode::addChild(local_40,pTVar4);
    if (local_88 != &local_78) {
      operator_delete(local_88,local_78 + 1);
    }
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] + 1);
    }
    pTVar4 = (TestNode *)operator_new(0x80);
    pCVar2 = (local_48->super_TestCaseGroup).m_context;
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"vertex_binding_offset_","");
    plVar6 = (long *)std::__cxx11::string::append((char *)local_68);
    local_88 = &local_78;
    plVar7 = plVar6 + 2;
    if ((long *)*plVar6 == plVar7) {
      local_78 = *plVar7;
      lStack_70 = plVar6[3];
    }
    else {
      local_78 = *plVar7;
      local_88 = (long *)*plVar6;
    }
    *plVar6 = (long)plVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar4,pCVar2->m_testCtx,(char *)local_88,"Test VERTEX_BINDING_OFFSET");
    pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
    *(undefined4 *)&pTVar4[1].m_testCtx = uVar1;
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a65f0;
    tcu::TestNode::addChild(local_40,pTVar4);
    if (local_88 != &local_78) {
      operator_delete(local_88,local_78 + 1);
    }
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] + 1);
    }
    pTVar4 = (TestNode *)operator_new(0x80);
    pCVar2 = (local_48->super_TestCaseGroup).m_context;
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"vertex_binding_stride_","");
    plVar6 = (long *)std::__cxx11::string::append((char *)local_68);
    local_88 = &local_78;
    plVar7 = plVar6 + 2;
    if ((long *)*plVar6 == plVar7) {
      local_78 = *plVar7;
      lStack_70 = plVar6[3];
    }
    else {
      local_78 = *plVar7;
      local_88 = (long *)*plVar6;
    }
    *plVar6 = (long)plVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar4,pCVar2->m_testCtx,(char *)local_88,"Test VERTEX_BINDING_STRIDE");
    pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
    *(undefined4 *)&pTVar4[1].m_testCtx = uVar1;
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a6648;
    tcu::TestNode::addChild(local_40,pTVar4);
    if (local_88 != &local_78) {
      operator_delete(local_88,local_78 + 1);
    }
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] + 1);
    }
    pTVar4 = (TestNode *)operator_new(0x80);
    pCVar2 = (local_48->super_TestCaseGroup).m_context;
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"vertex_binding_buffer_","");
    plVar6 = (long *)std::__cxx11::string::append((char *)local_68);
    local_88 = &local_78;
    plVar7 = plVar6 + 2;
    if ((long *)*plVar6 == plVar7) {
      local_78 = *plVar7;
      lStack_70 = plVar6[3];
    }
    else {
      local_78 = *plVar7;
      local_88 = (long *)*plVar6;
    }
    *plVar6 = (long)plVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar4,pCVar2->m_testCtx,(char *)local_88,"Test VERTEX_BINDING_BUFFER");
    pTVar4[1]._vptr_TestNode = (_func_int **)pCVar2;
    *(undefined4 *)&pTVar4[1].m_testCtx = uVar1;
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a66a0;
    tcu::TestNode::addChild(local_40,pTVar4);
    if (local_88 != &local_78) {
      operator_delete(local_88,local_78 + 1);
    }
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] + 1);
    }
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x38);
  pTVar5 = (TestNode *)operator_new(0x80);
  pVVar3 = local_48;
  pCVar2 = (local_48->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar5,pCVar2->m_testCtx,"vertex_binding_divisor_mixed",
             "Test VERTEX_BINDING_DIVISOR");
  pTVar4 = local_40;
  pTVar5[1]._vptr_TestNode = (_func_int **)pCVar2;
  *(undefined4 *)&pTVar5[1].m_testCtx = 9;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a66f8;
  tcu::TestNode::addChild(local_40,pTVar5);
  pTVar5 = (TestNode *)operator_new(0x80);
  pCVar2 = (pVVar3->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar5,pCVar2->m_testCtx,"vertex_binding_offset_mixed",
             "Test VERTEX_BINDING_OFFSET");
  pTVar5[1]._vptr_TestNode = (_func_int **)pCVar2;
  *(undefined4 *)&pTVar5[1].m_testCtx = 9;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a6750;
  tcu::TestNode::addChild(pTVar4,pTVar5);
  pTVar5 = (TestNode *)operator_new(0x80);
  pCVar2 = (pVVar3->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar5,pCVar2->m_testCtx,"vertex_binding_stride_mixed",
             "Test VERTEX_BINDING_STRIDE");
  pTVar5[1]._vptr_TestNode = (_func_int **)pCVar2;
  *(undefined4 *)&pTVar5[1].m_testCtx = 9;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a67a8;
  tcu::TestNode::addChild(pTVar4,pTVar5);
  pTVar5 = (TestNode *)operator_new(0x80);
  pCVar2 = (pVVar3->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar5,pCVar2->m_testCtx,"vertex_binding_buffer_mixed",
             "Test VERTEX_BINDING_BUFFER");
  pTVar5[1]._vptr_TestNode = (_func_int **)pCVar2;
  *(undefined4 *)&pTVar5[1].m_testCtx = 9;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a6800;
  tcu::TestNode::addChild(pTVar4,pTVar5);
  return extraout_EAX;
}

Assistant:

void VertexAttributeBindingStateQueryTests::init (void)
{
	tcu::TestCaseGroup* const attributeGroup	= new TestCaseGroup(m_context, "vertex_attrib", "Vertex attribute state");
	tcu::TestCaseGroup* const indexedGroup		= new TestCaseGroup(m_context, "indexed", "Indexed state");

	addChild(attributeGroup);
	addChild(indexedGroup);

	// .vertex_attrib
	{
		static const struct Verifier
		{
			const char*		suffix;
			QueryType		type;
		} verifiers[] =
		{
			{ "",						QUERY_ATTRIBUTE_INTEGER					},	// avoid renaming tests
			{ "_getvertexattribfv",		QUERY_ATTRIBUTE_FLOAT					},
			{ "_getvertexattribiiv",	QUERY_ATTRIBUTE_PURE_INTEGER			},
			{ "_getvertexattribiuiv",	QUERY_ATTRIBUTE_PURE_UNSIGNED_INTEGER	},
		};

		for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(verifiers); ++verifierNdx)
		{
			attributeGroup->addChild(new AttributeBindingCase		(m_context,	(std::string("vertex_attrib_binding") + verifiers[verifierNdx].suffix).c_str(),			"Test VERTEX_ATTRIB_BINDING",			verifiers[verifierNdx].type));
			attributeGroup->addChild(new AttributeRelativeOffsetCase(m_context,	(std::string("vertex_attrib_relative_offset") + verifiers[verifierNdx].suffix).c_str(),	"Test VERTEX_ATTRIB_RELATIVE_OFFSET",	verifiers[verifierNdx].type));
		}
	}

	// .indexed
	{
		static const struct Verifier
		{
			const char*		name;
			QueryType		type;
		} verifiers[] =
		{
			{ "getintegeri",	QUERY_INDEXED_INTEGER	},
			{ "getintegeri64",	QUERY_INDEXED_INTEGER64	},
			{ "getboolean",		QUERY_INDEXED_BOOLEAN	},
		};

		// states

		for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(verifiers); ++verifierNdx)
		{
			indexedGroup->addChild(new VertexBindingDivisorCase	(m_context, (std::string("vertex_binding_divisor_") + verifiers[verifierNdx].name).c_str(),	"Test VERTEX_BINDING_DIVISOR",	verifiers[verifierNdx].type));
			indexedGroup->addChild(new VertexBindingOffsetCase	(m_context, (std::string("vertex_binding_offset_") + verifiers[verifierNdx].name).c_str(),	"Test VERTEX_BINDING_OFFSET",	verifiers[verifierNdx].type));
			indexedGroup->addChild(new VertexBindingStrideCase	(m_context, (std::string("vertex_binding_stride_") + verifiers[verifierNdx].name).c_str(),	"Test VERTEX_BINDING_STRIDE",	verifiers[verifierNdx].type));
			indexedGroup->addChild(new VertexBindingBufferCase	(m_context, (std::string("vertex_binding_buffer_") + verifiers[verifierNdx].name).c_str(),	"Test VERTEX_BINDING_BUFFER",	verifiers[verifierNdx].type));
		}

		// mixed apis

		indexedGroup->addChild(new MixedVertexBindingDivisorCase(m_context, "vertex_binding_divisor_mixed",	"Test VERTEX_BINDING_DIVISOR"));
		indexedGroup->addChild(new MixedVertexBindingOffsetCase	(m_context, "vertex_binding_offset_mixed",	"Test VERTEX_BINDING_OFFSET"));
		indexedGroup->addChild(new MixedVertexBindingStrideCase	(m_context, "vertex_binding_stride_mixed",	"Test VERTEX_BINDING_STRIDE"));
		indexedGroup->addChild(new MixedVertexBindingBufferCase	(m_context, "vertex_binding_buffer_mixed",	"Test VERTEX_BINDING_BUFFER"));
	}
}